

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringview.h
# Opt level: O1

bool QtPrivate::endsWith(QLatin1StringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  QLatin1StringView lhs;
  
  lVar4 = haystack.m_size;
  pcVar3 = (char *)needle.m_size;
  pcVar1 = needle.m_data;
  if ((haystack.m_data != (char *)0x0) && (pcVar1 = pcVar3, lVar4 != 0)) {
    if ((long)pcVar3 <= lVar4) {
      lhs.m_data = haystack.m_data + (lVar4 - (long)pcVar3);
      lhs.m_size = (qsizetype)pcVar3;
      iVar2 = compareStrings(lhs,needle,cs);
      return iVar2 == 0;
    }
    return false;
  }
  return pcVar1 == (char *)0x0;
}

Assistant:

constexpr bool isNull() const noexcept { return !data(); }